

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O0

void WavParserHelper::PrintFactChunk(FactChunk rhs)

{
  FactChunk FVar1;
  unsigned_long uVar2;
  undefined4 in_stack_0000000c;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string Data;
  
  std::allocator<char>::allocator();
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,&stack0x00000008,&local_29);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::allocator<char>::~allocator(&local_29);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::resize((ulong)local_28);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::operator+(&local_60,"ChunkID: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  PrintLog(&local_60,(ostream *)&std::cout);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)&local_60);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  rhs.ckSize = uVar2;
  std::__cxx11::to_string(&local_a0,CONCAT204(FVar1,in_stack_0000000c));
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::operator+(&local_80,"ChunkSize: ",&local_a0);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  PrintLog(&local_80,(ostream *)&std::cout);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)&local_80);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)&local_a0);
  uVar2 = rhs.ckSize;
  FVar1 = rhs;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::to_string(&local_e0,uVar2);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::operator+(&local_c0,"SampleLength: ",&local_e0);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  PrintLog(&local_c0,(ostream *)&std::cout);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)&local_c0);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)&local_e0);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  FVar1 = rhs;
  uVar2 = rhs.ckSize;
  rhs = FVar1;
  FVar1 = rhs;
  rhs.ckSize = uVar2;
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void WavParserHelper::PrintFactChunk(FactChunk rhs)
{
	//if not restrict size, there problem on \0 with char convert to string
	std::string Data(rhs.ckID);
	Data.resize(4);

	PrintLog("ChunkID: " + Data);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	PrintLog("SampleLength: " + std::to_string(rhs.dwSampleLength));

	std::cout << std::endl;
}